

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

CommandInfo * findCommandByName(String *fname)

{
  CommandInfo *this;
  _Elt_pointer ppCVar1;
  int iVar2;
  _Elt_pointer ppCVar3;
  _Map_pointer pppCVar4;
  _Elt_pointer ppCVar5;
  bool bVar6;
  String local_70;
  String local_50;
  
  ppCVar1 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  ppCVar3 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_last;
  pppCVar4 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppCVar5 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
  if (Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur !=
      Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    do {
      this = *ppCVar5;
      String::toUppercase(&local_70,fname);
      String::toUppercase(&local_50,&this->name);
      if (local_70._string._M_string_length == local_50._string._M_string_length) {
        if (local_70._string._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_70._string._M_dataplus._M_p,local_50._string._M_dataplus._M_p,
                       local_70._string._M_string_length);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
        operator_delete(local_50._string._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
        operator_delete(local_70._string._M_dataplus._M_p);
      }
      if (bVar6) {
        return this;
      }
      ppCVar5 = ppCVar5 + 1;
      if (ppCVar5 == ppCVar3) {
        ppCVar5 = pppCVar4[1];
        pppCVar4 = pppCVar4 + 1;
        ppCVar3 = ppCVar5 + 0x40;
      }
    } while (ppCVar5 != ppCVar1);
  }
  return (CommandInfo *)0x0;
}

Assistant:

CommandInfo* findCommandByName (String fname)
{
	for (CommandInfo* comm : Commands)
	{
		if (fname.toUppercase() == comm->name.toUppercase())
			return comm;
	}

	return null;
}